

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpAcceptor.cpp
# Opt level: O0

void __thiscall
gmlc::networking::TcpAcceptor::setLoggingFunction
          (TcpAcceptor *this,
          function<void_(int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
          *logFunc)

{
  AcceptingStates AVar1;
  runtime_error *this_00;
  function<void_(int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  *in_RSI;
  long in_RDI;
  function<void_(int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  *in_stack_ffffffffffffffe8;
  
  AVar1 = std::atomic<gmlc::networking::TcpAcceptor::AcceptingStates>::load
                    ((atomic<gmlc::networking::TcpAcceptor::AcceptingStates> *)(in_RDI + 0xe8),
                     seq_cst);
  if (AVar1 == OPENED) {
    std::
    function<void_(int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
    ::operator=(in_RSI,in_stack_ffffffffffffffe8);
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"cannot set logging function after socket is started");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void TcpAcceptor::setLoggingFunction(
    std::function<void(int loglevel, const std::string& logMessage)> logFunc)
{
    if (state.load() == AcceptingStates::OPENED) {
        logFunction = std::move(logFunc);
    } else {
        throw(std::runtime_error(
            "cannot set logging function after socket is started"));
    }
}